

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_openlib(lua_State *L,char *libname,luaL_Reg *l,int nup)

{
  int sizehint;
  int nup_local;
  luaL_Reg *l_local;
  char *libname_local;
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  if (libname != (char *)0x0) {
    sizehint = libsize(l);
    luaL_pushmodule(L,libname,sizehint);
    lua_rotate(L,-(nup + 1),1);
  }
  if (l == (luaL_Reg *)0x0) {
    lua_settop(L,-1 - nup);
  }
  else {
    luaL_setfuncs(L,l,nup);
  }
  return;
}

Assistant:

LUALIB_API void luaL_openlib (lua_State *L, const char *libname,
                               const luaL_Reg *l, int nup) {
  luaL_checkversion(L);
  if (libname) {
    luaL_pushmodule(L, libname, libsize(l));  /* get/create library table */
    lua_insert(L, -(nup + 1));  /* move library table to below upvalues */
  }
  if (l)
    luaL_setfuncs(L, l, nup);
  else
    lua_pop(L, nup);  /* remove upvalues */
}